

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O3

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,12>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_88;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  VectorXd local_50;
  MatrixXd local_40;
  
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_88.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_88,2,0x21);
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,0x21);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,0)
  ;
  *pSVar1 = 0.271462507014926;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,0)
  ;
  *pSVar1 = 0.2714625070149262;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,1)
  ;
  *pSVar1 = 0.45707498597014773;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,1)
  ;
  *pSVar1 = 0.27146250701492614;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,2)
  ;
  *pSVar1 = 0.27146250701492614;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,2)
  ;
  *pSVar1 = 0.4570749859701479;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,3)
  ;
  *pSVar1 = 0.1092578276593542;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,3)
  ;
  *pSVar1 = 0.10925782765935446;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,4)
  ;
  *pSVar1 = 0.7814843446812912;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,4)
  ;
  *pSVar1 = 0.10925782765935424;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,5)
  ;
  *pSVar1 = 0.10925782765935449;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,5)
  ;
  *pSVar1 = 0.7814843446812915;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,6)
  ;
  *pSVar1 = 0.4401116486585931;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,6)
  ;
  *pSVar1 = 0.11977670268281385;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,7)
  ;
  *pSVar1 = 0.4401116486585931;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,7)
  ;
  *pSVar1 = 0.44011164865859315;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,8)
  ;
  *pSVar1 = 0.11977670268281379;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,8)
  ;
  *pSVar1 = 0.44011164865859326;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,9)
  ;
  *pSVar1 = 0.2554542286385173;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,9)
  ;
  *pSVar1 = 0.11629601967792665;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,10
                     );
  *pSVar1 = 0.6282497516835561;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,10
                     );
  *pSVar1 = 0.25545422863851736;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xb);
  *pSVar1 = 0.11629601967792663;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xb);
  *pSVar1 = 0.6282497516835562;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xc);
  *pSVar1 = 0.6282497516835561;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xc);
  *pSVar1 = 0.11629601967792665;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xd);
  *pSVar1 = 0.25545422863851736;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xd);
  *pSVar1 = 0.6282497516835562;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xe);
  *pSVar1 = 0.1162960196779265;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xe);
  *pSVar1 = 0.2554542286385176;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0xf);
  *pSVar1 = 0.12727971723358936;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0xf);
  *pSVar1 = 0.021382490256170634;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x10);
  *pSVar1 = 0.85133779251024;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x10);
  *pSVar1 = 0.12727971723358933;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x11);
  *pSVar1 = 0.021382490256170728;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x11);
  *pSVar1 = 0.8513377925102402;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x12);
  *pSVar1 = 0.85133779251024;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x12);
  *pSVar1 = 0.021382490256170634;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x13);
  *pSVar1 = 0.12727971723358938;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x13);
  *pSVar1 = 0.8513377925102402;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x14);
  *pSVar1 = 0.021382490256170394;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x14);
  *pSVar1 = 0.12727971723358966;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x15);
  *pSVar1 = 0.29165567973834094;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x15);
  *pSVar1 = 0.023034156355267177;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x16);
  *pSVar1 = 0.6853101639063919;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x16);
  *pSVar1 = 0.291655679738341;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x17);
  *pSVar1 = 0.023034156355267177;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x17);
  *pSVar1 = 0.6853101639063921;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x18);
  *pSVar1 = 0.6853101639063919;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x18);
  *pSVar1 = 0.023034156355267177;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x19);
  *pSVar1 = 0.291655679738341;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x19);
  *pSVar1 = 0.685310163906392;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1a);
  *pSVar1 = 0.023034156355267038;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1a);
  *pSVar1 = 0.2916556797383412;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1b);
  *pSVar1 = 0.4882037509455415;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1b);
  *pSVar1 = 0.023592498108916914;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1c);
  *pSVar1 = 0.48820375094554147;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1c);
  *pSVar1 = 0.48820375094554164;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1d);
  *pSVar1 = 0.023592498108916865;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1d);
  *pSVar1 = 0.48820375094554175;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1e);
  *pSVar1 = 0.024646363436335462;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1e);
  *pSVar1 = 0.02464636343633577;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x1f);
  *pSVar1 = 0.9507072731273287;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x1f);
  *pSVar1 = 0.02464636343633545;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,0,
                      0x20);
  *pSVar1 = 0.024646363436335916;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_88,1,
                      0x20);
  *pSVar1 = 0.9507072731273288;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0);
  *pSVar2 = 0.03127060659795137;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,1);
  *pSVar2 = 0.03127060659795137;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,2);
  *pSVar2 = 0.03127060659795137;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,3);
  *pSVar2 = 0.014243026034438767;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,4);
  *pSVar2 = 0.014243026034438767;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,5);
  *pSVar2 = 0.014243026034438767;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,6);
  *pSVar2 = 0.024959167464030464;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,7);
  *pSVar2 = 0.024959167464030464;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,8);
  *pSVar2 = 0.024959167464030464;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,9);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,10);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xb);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xc);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xd);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xe);
  *pSVar2 = 0.021613681829707094;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0xf);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x10);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x11);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x12);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x13);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x14);
  *pSVar2 = 0.007541838788255717;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x15);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x16);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x17);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x18);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x19);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1a);
  *pSVar2 = 0.010891792519303773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1b);
  *pSVar2 = 0.012133419040726012;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1c);
  *pSVar2 = 0.012133419040726012;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1d);
  *pSVar2 = 0.012133419040726012;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1e);
  *pSVar2 = 0.003965821254986818;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x1f);
  *pSVar2 = 0.003965821254986818;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,0x20);
  *pSVar2 = 0.003965821254986818;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_88.m_storage.m_data;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_88.m_storage.m_rows;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_88.m_storage.m_cols;
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_88.m_storage.m_cols = 0;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_68.m_storage.m_data;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_68.m_storage.m_rows;
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_40,&local_50,0xc);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_68.m_storage.m_data);
  free(local_88.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 12>() { // NOLINT
  Eigen::MatrixXd points(2, 33);
  Eigen::VectorXd weights(33);

  points(0, 0) = 0.27146250701492602442;
  points(1, 0) = 0.27146250701492619095;
  points(0, 1) = 0.45707498597014772912;
  points(1, 1) = 0.27146250701492613544;
  points(0, 2) = 0.27146250701492613544;
  points(1, 2) = 0.45707498597014789565;
  points(0, 3) = 0.10925782765935419805;
  points(1, 3) = 0.10925782765935446172;
  points(0, 4) = 0.78148434468129124308;
  points(1, 4) = 0.10925782765935423968;
  points(0, 5) = 0.10925782765935448948;
  points(1, 5) = 0.78148434468129146513;
  points(0, 6) = 0.44011164865859309092;
  points(1, 6) = 0.11977670268281384591;
  points(0, 7) = 0.44011164865859309092;
  points(1, 7) = 0.44011164865859314643;
  points(0, 8) = 0.1197767026828137904;
  points(1, 8) = 0.44011164865859325745;
  points(0, 9) = 0.2554542286385173;
  points(1, 9) = 0.11629601967792664585;
  points(0, 10) = 0.62824975168355612354;
  points(1, 10) = 0.25545422863851735551;
  points(0, 11) = 0.11629601967792663197;
  points(1, 11) = 0.62824975168355623456;
  points(0, 12) = 0.62824975168355612354;
  points(1, 12) = 0.11629601967792664585;
  points(0, 13) = 0.25545422863851735551;
  points(1, 13) = 0.62824975168355623456;
  points(0, 14) = 0.1162960196779264932;
  points(1, 14) = 0.25545422863851757755;
  points(0, 15) = 0.12727971723358935674;
  points(1, 15) = 0.021382490256170633841;
  points(0, 16) = 0.85133779251023999901;
  points(1, 16) = 0.12727971723358932898;
  points(0, 17) = 0.021382490256170727516;
  points(1, 17) = 0.85133779251024022106;
  points(0, 18) = 0.85133779251023999901;
  points(1, 18) = 0.021382490256170633841;
  points(0, 19) = 0.1272797172335893845;
  points(1, 19) = 0.85133779251024022106;
  points(0, 20) = 0.021382490256170394449;
  points(1, 20) = 0.12727971723358966205;
  points(0, 21) = 0.29165567973834094495;
  points(1, 21) = 0.023034156355267176863;
  points(0, 22) = 0.68531016390639187819;
  points(1, 22) = 0.29165567973834100046;
  points(0, 23) = 0.023034156355267176863;
  points(1, 23) = 0.68531016390639210023;
  points(0, 24) = 0.68531016390639187819;
  points(1, 24) = 0.023034156355267176863;
  points(0, 25) = 0.29165567973834100046;
  points(1, 25) = 0.68531016390639198921;
  points(0, 26) = 0.023034156355267038085;
  points(1, 26) = 0.29165567973834122251;
  points(0, 27) = 0.48820375094554152584;
  points(1, 27) = 0.023592498108916913624;
  points(0, 28) = 0.48820375094554147033;
  points(1, 28) = 0.48820375094554163686;
  points(0, 29) = 0.023592498108916865052;
  points(1, 29) = 0.48820375094554174789;
  points(0, 30) = 0.024646363436335461811;
  points(1, 30) = 0.024646363436335770591;
  points(0, 31) = 0.9507072731273287225;
  points(1, 31) = 0.024646363436335451402;
  points(0, 32) = 0.024646363436335916308;
  points(1, 32) = 0.95070727312732883352;

  weights(0) = 0.031270606597951368377;
  weights(1) = 0.031270606597951368377;
  weights(2) = 0.031270606597951368377;
  weights(3) = 0.014243026034438766719;
  weights(4) = 0.014243026034438766719;
  weights(5) = 0.014243026034438766719;
  weights(6) = 0.024959167464030464212;
  weights(7) = 0.024959167464030464212;
  weights(8) = 0.024959167464030464212;
  weights(9) = 0.021613681829707093868;
  weights(10) = 0.021613681829707093868;
  weights(11) = 0.021613681829707093868;
  weights(12) = 0.021613681829707093868;
  weights(13) = 0.021613681829707093868;
  weights(14) = 0.021613681829707093868;
  weights(15) = 0.0075418387882557171367;
  weights(16) = 0.0075418387882557171367;
  weights(17) = 0.0075418387882557171367;
  weights(18) = 0.0075418387882557171367;
  weights(19) = 0.0075418387882557171367;
  weights(20) = 0.0075418387882557171367;
  weights(21) = 0.010891792519303772693;
  weights(22) = 0.010891792519303772693;
  weights(23) = 0.010891792519303772693;
  weights(24) = 0.010891792519303772693;
  weights(25) = 0.010891792519303772693;
  weights(26) = 0.010891792519303772693;
  weights(27) = 0.012133419040726012295;
  weights(28) = 0.012133419040726012295;
  weights(29) = 0.012133419040726012295;
  weights(30) = 0.003965821254986817701;
  weights(31) = 0.003965821254986817701;
  weights(32) = 0.003965821254986817701;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 12);
}